

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_aggregate_optimizer.cpp
# Opt level: O1

void __thiscall
duckdb::CommonAggregateOptimizer::VisitOperator(CommonAggregateOptimizer *this,LogicalOperator *op)

{
  LogicalAggregate *aggr;
  uint uVar1;
  CommonAggregateOptimizer common_aggregate;
  CommonAggregateOptimizer local_58;
  
  uVar1 = op->type - 0x4b;
  if (((uVar1 < 5) && (uVar1 != 3)) || (op->type == LOGICAL_PROJECTION)) {
    local_58.super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor =
         (_func_int **)&PTR__CommonAggregateOptimizer_0247ef60;
    local_58.aggregate_map._M_h._M_buckets = &local_58.aggregate_map._M_h._M_single_bucket;
    local_58.aggregate_map._M_h._M_bucket_count = 1;
    local_58.aggregate_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_58.aggregate_map._M_h._M_element_count = 0;
    local_58.aggregate_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_58.aggregate_map._M_h._M_rehash_policy._M_next_resize = 0;
    local_58.aggregate_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
    StandardVisitOperator(&local_58,op);
    local_58.super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor =
         (_func_int **)&PTR__CommonAggregateOptimizer_0247ef60;
    ::std::
    _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ColumnBinding>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_58.aggregate_map._M_h);
  }
  else {
    StandardVisitOperator(this,op);
    if (op->type == LOGICAL_AGGREGATE_AND_GROUP_BY) {
      aggr = LogicalOperator::Cast<duckdb::LogicalAggregate>(op);
      ExtractCommonAggregates(this,aggr);
      return;
    }
  }
  return;
}

Assistant:

void CommonAggregateOptimizer::VisitOperator(LogicalOperator &op) {
	switch (op.type) {
	case LogicalOperatorType::LOGICAL_UNION:
	case LogicalOperatorType::LOGICAL_EXCEPT:
	case LogicalOperatorType::LOGICAL_INTERSECT:
	case LogicalOperatorType::LOGICAL_MATERIALIZED_CTE:
	case LogicalOperatorType::LOGICAL_PROJECTION: {
		CommonAggregateOptimizer common_aggregate;
		common_aggregate.StandardVisitOperator(op);
		return;
	}
	default:
		break;
	}

	StandardVisitOperator(op);
	if (op.type == LogicalOperatorType::LOGICAL_AGGREGATE_AND_GROUP_BY) {
		ExtractCommonAggregates(op.Cast<LogicalAggregate>());
	}
}